

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_bmp_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  int iVar1;
  int rgb_dir;
  bool bVar2;
  uint pad;
  char *fmt;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  bVar2 = comp != 4;
  if (bVar2) {
    pad = x & 3;
    rgb_dir = (x * 3 + pad) * y + 0x36;
    fmt = "11 4 22 44 44 22 444444";
    uVar6 = 0;
    uVar5 = 0x18;
    uVar4 = 0x28;
    uVar3 = 0x36;
    iVar1 = rgb_dir;
  }
  else {
    rgb_dir = 1;
    fmt = "11 4 22 44 44 22 444444 4444 4 444 444 444 444";
    uVar6 = 3;
    uVar5 = 0x20;
    uVar4 = 0x6c;
    uVar3 = 0x7a;
    pad = 0;
    comp = 4;
    iVar1 = x * y * 4 + 0x7a;
  }
  iVar1 = stbiw__outfile(s,rgb_dir,y,x,y,comp,1,data,(uint)!bVar2,pad,fmt,0x42,0x4d,iVar1,0,0,uVar3,
                         uVar4,x,y,1,uVar5,uVar6,0,0,0,0,0);
  return iVar1;
}

Assistant:

static int stbi_write_bmp_core(stbi__write_context *s, int x, int y, int comp, const void *data)
{
   if (comp != 4) {
      // write RGB bitmap
      int pad = (-x*3) & 3;
      return stbiw__outfile(s,-1,-1,x,y,comp,1,(void *) data,0,pad,
              "11 4 22 4" "4 44 22 444444",
              'B', 'M', 14+40+(x*3+pad)*y, 0,0, 14+40,  // file header
               40, x,y, 1,24, 0,0,0,0,0,0);             // bitmap header
   } else {
      // RGBA bitmaps need a v4 header
      // use BI_BITFIELDS mode with 32bpp and alpha mask
      // (straight BI_RGB with alpha mask doesn't work in most readers)
      return stbiw__outfile(s,-1,-1,x,y,comp,1,(void *)data,1,0,
         "11 4 22 4" "4 44 22 444444 4444 4 444 444 444 444",
         'B', 'M', 14+108+x*y*4, 0, 0, 14+108, // file header
         108, x,y, 1,32, 3,0,0,0,0,0, 0xff0000,0xff00,0xff,0xff000000u, 0, 0,0,0, 0,0,0, 0,0,0, 0,0,0); // bitmap V4 header
   }
}